

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall randomx::Instruction::print(Instruction *this,ostream *os)

{
  ostream *poVar1;
  ostream *in_RSI;
  byte *in_RDI;
  InstructionFormatter handler;
  code *local_40;
  
  poVar1 = std::operator<<(in_RSI,*(char **)(names + (ulong)*in_RDI * 8));
  std::operator<<(poVar1," ");
  local_40 = *(code **)(engine + (ulong)*in_RDI * 0x10);
  if (((ulong)local_40 & 1) != 0) {
    local_40 = *(code **)(local_40 +
                         *(long *)(in_RDI + *(long *)(engine + (ulong)*in_RDI * 0x10 + 8)) + -1);
  }
  (*local_40)(in_RDI + *(long *)(engine + (ulong)*in_RDI * 0x10 + 8),in_RSI);
  return;
}

Assistant:

void Instruction::print(std::ostream& os) const {
		os << names[opcode] << " ";
		auto handler = engine[opcode];
		(this->*handler)(os);
	}